

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O3

bool __thiscall
cmOrderDirectoriesConstraint::FileMayConflict
          (cmOrderDirectoriesConstraint *this,string *dir,string *name)

{
  bool bVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  const_iterator cVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string file;
  string local_a0;
  undefined8 local_80;
  undefined1 *local_78;
  undefined1 local_70 [32];
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined8 local_40;
  undefined1 *local_38;
  size_type local_30;
  pointer local_28;
  
  local_50._M_str = (dir->_M_dataplus)._M_p;
  local_50._M_len = dir->_M_string_length;
  local_78 = local_70;
  local_80 = 1;
  local_70[0] = 0x2f;
  local_40 = 1;
  local_28 = (name->_M_dataplus)._M_p;
  local_30 = name->_M_string_length;
  views._M_len = 3;
  views._M_array = &local_50;
  local_38 = local_78;
  cmCatViews_abi_cxx11_(&local_a0,views);
  bVar1 = cmsys::SystemTools::FileExists(&local_a0,true);
  if (bVar1) {
    bVar1 = cmsys::SystemTools::SameFile(&this->FullPath,&local_a0);
    bVar1 = !bVar1;
  }
  else {
    this_00 = &cmGlobalGenerator::GetDirectoryContent(this->GlobalGenerator,dir,false)->_M_t;
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(this_00,name);
    bVar1 = (_Rb_tree_header *)cVar2._M_node != &(this_00->_M_impl).super__Rb_tree_header;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool cmOrderDirectoriesConstraint::FileMayConflict(std::string const& dir,
                                                   std::string const& name)
{
  // Check if the file exists on disk.
  std::string file = cmStrCat(dir, '/', name);
  if (cmSystemTools::FileExists(file, true)) {
    // The file conflicts only if it is not the same as the original
    // file due to a symlink or hardlink.
    return !cmSystemTools::SameFile(this->FullPath, file);
  }

  // Check if the file will be built by cmake.
  std::set<std::string> const& files =
    (this->GlobalGenerator->GetDirectoryContent(dir, false));
  auto fi = files.find(name);
  return fi != files.end();
}